

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixMapfile(unixFile *pFd,i64 nMap)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  stat statbuf;
  long local_b0;
  int local_9c;
  undefined1 local_98 [32];
  i64 in_stack_ffffffffffffff88;
  unixFile *in_stack_ffffffffffffff90;
  long local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x4c) < 1) {
    local_b0 = in_RSI;
    if (in_RSI < 0) {
      memset(local_98,0xaa,0x90);
      iVar2 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(in_RDI + 0x18),local_98);
      if (iVar2 != 0) {
        local_9c = 0x70a;
        goto LAB_00155f3a;
      }
      local_b0 = local_68;
    }
    if (*(long *)(in_RDI + 0x60) < local_b0) {
      local_b0 = *(long *)(in_RDI + 0x60);
    }
    if (local_b0 != *(long *)(in_RDI + 0x50)) {
      unixRemapfile(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    local_9c = 0;
  }
  else {
    local_9c = 0;
  }
LAB_00155f3a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9c;
  }
  __stack_chk_fail();
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nMap){
  assert( nMap>=0 || pFd->nFetchOut==0 );
  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    if( osFstat(pFd->h, &statbuf) ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( nMap!=pFd->mmapSize ){
    unixRemapfile(pFd, nMap);
  }

  return SQLITE_OK;
}